

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall
antlr::CharScanner::CharScanner(CharScanner *this,InputBuffer *cb,bool case_sensitive)

{
  byte in_DL;
  CharScanner *in_RDI;
  TokenRefCount<antlr::Token> *this_00;
  LexerInputState *p;
  LexerInputState *in_stack_ffffffffffffffd0;
  CharScannerLiteralsLess local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  TokenStream::TokenStream(&in_RDI->super_TokenStream);
  (in_RDI->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_0050bc08;
  std::__cxx11::string::string((string *)&in_RDI->text);
  in_RDI->saveConsumedInput = true;
  in_RDI->caseSensitive = (bool)(local_11 & 1);
  p = (LexerInputState *)&in_RDI->literals;
  CharScannerLiteralsLess::CharScannerLiteralsLess(&local_20,in_RDI);
  this_00 = (TokenRefCount<antlr::Token> *)&stack0xffffffffffffffd3;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)0x1cbdab);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)in_stack_ffffffffffffffd0,(CharScannerLiteralsLess *)p,(allocator_type *)in_RDI);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x1cbdcb);
  TokenRefCount<antlr::Token>::TokenRefCount(this_00,(Token *)&in_RDI->_returnToken);
  operator_new(0x50);
  LexerInputState::LexerInputState(in_stack_ffffffffffffffd0,(InputBuffer *)p);
  RefCount<antlr::LexerInputState>::RefCount
            ((RefCount<antlr::LexerInputState> *)in_stack_ffffffffffffffd0,p);
  in_RDI->commitToPath = false;
  in_RDI->tabsize = 8;
  in_RDI->traceDepth = 0;
  (*(in_RDI->super_TokenStream)._vptr_TokenStream[0x2a])(in_RDI,CommonToken::factory);
  return;
}

Assistant:

CharScanner::CharScanner(InputBuffer& cb, bool case_sensitive )
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, caseSensitive(case_sensitive)
	, literals(CharScannerLiteralsLess(this))
	, inputState(new LexerInputState(cb))
	, commitToPath(false)
	, tabsize(8)
	, traceDepth(0)
{
	setTokenObjectFactory(&CommonToken::factory);
}